

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

AInventory * P_DropItem(AActor *source,PClassActor *type,int dropamount,int chance)

{
  double this;
  PClassActor *type_00;
  bool bVar1;
  int iVar2;
  AInventory *inv;
  DVector3 local_58;
  int local_3c;
  double dStack_38;
  int style;
  double spawnz;
  AActor *mo;
  int chance_local;
  int dropamount_local;
  PClassActor *type_local;
  AActor *source_local;
  
  if ((type != (PClassActor *)0x0) &&
     (mo._0_4_ = chance, mo._4_4_ = dropamount, _chance_local = type,
     type_local = (PClassActor *)source, iVar2 = FRandom::operator()(&pr_dropitem), iVar2 <= (int)mo
     )) {
    dStack_38 = 0.0;
    if ((i_compatflags & 0x80U) == 0) {
      local_3c = FIntCVar::operator_cast_to_int(&sv_dropstyle);
      if (local_3c == 0) {
        local_3c = gameinfo.defaultdropstyle;
      }
      if (local_3c == 2) {
        dStack_38 = 24.0;
      }
      else {
        dStack_38 = *(double *)&type_local->BloodColor / 2.0;
      }
    }
    type_00 = _chance_local;
    AActor::PosPlusZ(&local_58,(AActor *)type_local,dStack_38);
    spawnz = (double)Spawn(type_00,&local_58,ALLOW_REPLACE);
    if ((AActor *)spawnz != (AActor *)0x0) {
      TFlags<ActorFlag,_unsigned_int>::operator|=(&((AActor *)spawnz)->flags,MF_DROPPED);
      operator~((int)&inv + MF_SHOOTABLE);
      TFlags<ActorFlag,_unsigned_int>::operator&=
                ((TFlags<ActorFlag,_unsigned_int> *)((long)spawnz + 0x1bc),(Self *)((long)&inv + 4))
      ;
      if ((i_compatflags & 0x80U) == 0) {
        P_TossItem((AActor *)spawnz);
      }
      bVar1 = DObject::IsKindOf((DObject *)spawnz,AInventory::RegistrationInfo.MyClass);
      this = spawnz;
      if (bVar1) {
        ModifyDropAmount((AInventory *)spawnz,mo._4_4_);
        *(uint *)((long)this + 0x4e8) = *(uint *)((long)this + 0x4e8) | 0x400000;
        bVar1 = AInventory::CallSpecialDropAction((AInventory *)this,(AActor *)type_local);
        if (!bVar1) {
          return (AInventory *)this;
        }
        (**(code **)(*(long *)this + 0x20))();
        return (AInventory *)0x0;
      }
    }
  }
  return (AInventory *)0x0;
}

Assistant:

AInventory *P_DropItem (AActor *source, PClassActor *type, int dropamount, int chance)
{
	if (type != NULL && pr_dropitem() <= chance)
	{
		AActor *mo;
		double spawnz = 0;

		if (!(i_compatflags & COMPATF_NOTOSSDROPS))
		{
			int style = sv_dropstyle;
			if (style == 0)
			{
				style = gameinfo.defaultdropstyle;
			}
			if (style == 2)
			{
				spawnz = 24;
			}
			else
			{
				spawnz = source->Height / 2;
			}
		}
		mo = Spawn(type, source->PosPlusZ(spawnz), ALLOW_REPLACE);
		if (mo != NULL)
		{
			mo->flags |= MF_DROPPED;
			mo->flags &= ~MF_NOGRAVITY;	// [RH] Make sure it is affected by gravity
			if (!(i_compatflags & COMPATF_NOTOSSDROPS))
			{
				P_TossItem (mo);
			}
			if (mo->IsKindOf (RUNTIME_CLASS(AInventory)))
			{
				AInventory *inv = static_cast<AInventory *>(mo);
				ModifyDropAmount(inv, dropamount);
				inv->ItemFlags |= IF_TOSSED;
				if (inv->CallSpecialDropAction (source))
				{
					// The special action indicates that the item should not spawn
					inv->Destroy();
					return NULL;
				}
				return inv;
			}
			// we can't really return an AInventory pointer to a non-inventory item here, can we?
		}
	}
	return NULL;
}